

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O0

void __thiscall
graphics101::VertexAndFaceArrays::uploadFaces
          (VertexAndFaceArrays *this,
          vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
          *face_indices,GLenum mode)

{
  bool bVar1;
  const_reference v;
  int *face_indices_00;
  size_type sVar2;
  GLenum mode_local;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  *face_indices_local;
  VertexAndFaceArrays *this_local;
  
  bVar1 = std::
          vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
          ::empty(face_indices);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!face_indices.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                  ,0xa6,
                  "void graphics101::VertexAndFaceArrays::uploadFaces(const std::vector<ivec3> &, GLenum)"
                 );
  }
  v = std::
      vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ::front(face_indices);
  face_indices_00 = glm::value_ptr<int,(glm::qualifier)0>(v);
  sVar2 = std::
          vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
          ::size(face_indices);
  uploadFaces(this,face_indices_00,(int)sVar2 * 3,mode);
  return;
}

Assistant:

void VertexAndFaceArrays::uploadFaces( const std::vector< ivec3 >& face_indices, GLenum mode ) {
    assert( !face_indices.empty() );
    assert( sizeof( ivec3 ) == 3*sizeof( GLint ) );
    
    uploadFaces( glm::value_ptr( face_indices.front() ), 3*face_indices.size(), mode );
}